

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

PHYSFS_File * doOpenWrite(char *_fname,int appending)

{
  void *pvVar1;
  _func_PHYSFS_Io_ptr_void_ptr_char_ptr *p_Var2;
  _func_void_PHYSFS_Io_ptr *p_Var3;
  DirHandle *pDVar4;
  int iVar5;
  size_t sVar6;
  undefined8 *puVar7;
  undefined8 uVar8;
  PHYSFS_Io *pPVar9;
  FileHandle *pFVar10;
  char **ppcVar11;
  PHYSFS_ErrorCode PVar12;
  char *pcVar13;
  char *local_28;
  
  ppcVar11 = &local_28;
  if (_fname == (char *)0x0) {
    PVar12 = PHYSFS_ERR_INVALID_ARGUMENT;
LAB_001092f5:
    PHYSFS_setErrorCode(PVar12);
    return (PHYSFS_File *)0x0;
  }
  sVar6 = strlen(_fname);
  if (sVar6 + 1 < 0x100) {
    ppcVar11 = (char **)((long)&local_28 - (sVar6 + 0x18 & 0xfffffffffffffff0));
    uVar8 = 0;
    puVar7 = ppcVar11;
  }
  else {
    puVar7 = (undefined8 *)(*__PHYSFS_AllocatorHooks.Malloc)(sVar6 + 9);
    if (puVar7 == (undefined8 *)0x0) {
      PVar12 = PHYSFS_ERR_OUT_OF_MEMORY;
      goto LAB_001092f5;
    }
    uVar8 = 1;
  }
  *puVar7 = uVar8;
  local_28 = (char *)(puVar7 + 1);
  ppcVar11[-1] = (char *)0x109222;
  iVar5 = sanitizePlatformIndependentPath(_fname,(char *)(puVar7 + 1));
  if (iVar5 == 0) {
    pFVar10 = (FileHandle *)0x0;
    goto LAB_001092d4;
  }
  ppcVar11[-1] = (char *)0x109236;
  __PHYSFS_platformGrabMutex(stateLock);
  pDVar4 = writeDir;
  if (writeDir == (DirHandle *)0x0) {
    PVar12 = PHYSFS_ERR_NO_WRITE_DIR;
LAB_001092c0:
    ppcVar11[-1] = (char *)0x1092c5;
    PHYSFS_setErrorCode(PVar12);
LAB_001092c5:
    pFVar10 = (FileHandle *)0x0;
  }
  else {
    pFVar10 = (FileHandle *)0x0;
    ppcVar11[-1] = (char *)0x109253;
    iVar5 = verifyPath(writeDir,&local_28,0);
    pcVar13 = local_28;
    if (iVar5 != 0) {
      pvVar1 = pDVar4->opaque;
      p_Var2 = (&pDVar4->funcs->openWrite)[appending != 0];
      ppcVar11[-1] = (char *)0x10926d;
      pPVar9 = (*p_Var2)(pvVar1,pcVar13);
      if (pPVar9 == (PHYSFS_Io *)0x0) goto LAB_001092c5;
      ppcVar11[-1] = (char *)0x109280;
      pFVar10 = (FileHandle *)(*__PHYSFS_AllocatorHooks.Malloc)(0x40);
      if (pFVar10 == (FileHandle *)0x0) {
        p_Var3 = pPVar9->destroy;
        ppcVar11[-1] = (char *)0x109311;
        (*p_Var3)(pPVar9);
        PVar12 = PHYSFS_ERR_OUT_OF_MEMORY;
        goto LAB_001092c0;
      }
      *(undefined8 *)&pFVar10->forReading = 0;
      pFVar10->dirHandle = (DirHandle *)0x0;
      pFVar10->buffill = 0;
      pFVar10->bufpos = 0;
      pFVar10->buffer = (PHYSFS_uint8 *)0x0;
      pFVar10->bufsize = 0;
      pFVar10->io = pPVar9;
      pFVar10->dirHandle = pDVar4;
      pFVar10->next = openWriteList;
      openWriteList = pFVar10;
    }
  }
  ppcVar11[-1] = (char *)0x1092d4;
  __PHYSFS_platformReleaseMutex(stateLock);
LAB_001092d4:
  if ((local_28 != (char *)0x0) && (*(long *)(local_28 + -8) != 0)) {
    pcVar13 = local_28 + -8;
    ppcVar11[-1] = (char *)0x1092ee;
    (*__PHYSFS_AllocatorHooks.Free)(pcVar13);
  }
  return (PHYSFS_File *)pFVar10;
}

Assistant:

static PHYSFS_File *doOpenWrite(const char *_fname, int appending)
{
    FileHandle *fh = NULL;
    size_t len;
    char *fname;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    len = strlen(_fname) + 1;
    fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF(!fname, PHYSFS_ERR_OUT_OF_MEMORY, 0);

    if (sanitizePlatformIndependentPath(_fname, fname))
    {
        PHYSFS_Io *io = NULL;
        DirHandle *h = NULL;
        const PHYSFS_Archiver *f;

        __PHYSFS_platformGrabMutex(stateLock);

        GOTO_IF(!writeDir, PHYSFS_ERR_NO_WRITE_DIR, doOpenWriteEnd);

        h = writeDir;
        GOTO_IF_ERRPASS(!verifyPath(h, &fname, 0), doOpenWriteEnd);

        f = h->funcs;
        if (appending)
            io = f->openAppend(h->opaque, fname);
        else
            io = f->openWrite(h->opaque, fname);

        GOTO_IF_ERRPASS(!io, doOpenWriteEnd);

        fh = (FileHandle *) allocator.Malloc(sizeof (FileHandle));
        if (fh == NULL)
        {
            io->destroy(io);
            GOTO(PHYSFS_ERR_OUT_OF_MEMORY, doOpenWriteEnd);
        } /* if */
        else
        {
            memset(fh, '\0', sizeof (FileHandle));
            fh->io = io;
            fh->dirHandle = h;
            fh->next = openWriteList;
            openWriteList = fh;
        } /* else */

        doOpenWriteEnd:
        __PHYSFS_platformReleaseMutex(stateLock);
    } /* if */

    __PHYSFS_smallFree(fname);
    return ((PHYSFS_File *) fh);
}